

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

bool whisper_kv_cache_init
               (whisper_kv_cache *cache,ggml_backend_t backend,ggml_type wtype,int64_t n_text_state,
               int64_t n_text_layer,int n_ctx)

{
  long lVar1;
  ggml_tensor *pgVar2;
  ggml_backend_buffer_t pgVar3;
  char *format;
  long lVar4;
  
  lVar1 = ggml_tensor_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&cache->ctx_buf,lVar1 * 2);
  cache->head = 0;
  cache->size = n_ctx;
  std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::clear(&cache->cells);
  std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::resize(&cache->cells,(long)n_ctx);
  lVar1 = ggml_init();
  if (lVar1 == 0) {
    format = "%s: failed to allocate memory for the kv cache context\n";
  }
  else {
    lVar4 = n_text_layer * n_text_state * (long)n_ctx;
    pgVar2 = (ggml_tensor *)ggml_new_tensor_1d(lVar1,wtype,lVar4);
    cache->k = pgVar2;
    pgVar2 = (ggml_tensor *)ggml_new_tensor_1d(lVar1,wtype,lVar4);
    cache->v = pgVar2;
    pgVar3 = (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(lVar1,backend);
    cache->buffer = pgVar3;
    if (pgVar3 != (ggml_backend_buffer_t)0x0) {
      ggml_backend_buffer_clear(pgVar3,0);
      ggml_free(lVar1);
      return true;
    }
    format = "%s: failed to allocate memory for the kv cache\n";
  }
  whisper_log_internal(GGML_LOG_LEVEL_ERROR,format,"whisper_kv_cache_init");
  return false;
}

Assistant:

static bool whisper_kv_cache_init(
             struct whisper_kv_cache & cache,
                      ggml_backend_t   backend,
                           ggml_type   wtype,
                             int64_t   n_text_state,
                             int64_t   n_text_layer,
                                 int   n_ctx) {
    const int64_t n_mem      = n_text_layer*n_ctx;
    const int64_t n_elements = n_text_state*n_mem;

    cache.ctx_buf.resize(2*ggml_tensor_overhead());

    struct ggml_init_params params = {
        /*.mem_size   =*/ cache.ctx_buf.size(),
        /*.mem_buffer =*/ cache.ctx_buf.data(),
        /*.no_alloc   =*/ true,
    };

    cache.head = 0;
    cache.size = n_ctx;

    cache.cells.clear();
    cache.cells.resize(n_ctx);

    struct ggml_context * ctx = ggml_init(params);

    if (!ctx) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for the kv cache context\n", __func__);
        return false;
    }

    cache.k = ggml_new_tensor_1d(ctx, wtype, n_elements);
    cache.v = ggml_new_tensor_1d(ctx, wtype, n_elements);

    cache.buffer = ggml_backend_alloc_ctx_tensors(ctx, backend);
    if (!cache.buffer) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for the kv cache\n", __func__);
        return false;
    }

    ggml_backend_buffer_clear(cache.buffer, 0);

    ggml_free(ctx);

    return true;
}